

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-logger-winit.cpp
# Opt level: O0

void __thiscall
debug_logger_wrong_initialization::test_method(debug_logger_wrong_initialization *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  string *psVar3;
  long lVar4;
  CustomEntity *local_120;
  uint local_d0;
  allocator<char> local_c9;
  uint i;
  allocator<char> local_a1;
  string local_a0 [32];
  CustomEntity *local_80;
  CustomEntity *entity;
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  debug_logger_wrong_initialization *local_10;
  debug_logger_wrong_initialization *this_local;
  
  local_10 = this;
  dynamicgraph::RealTimeLogger::instance();
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-logger-winit.cpp"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x46,&local_30);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,prev,(char (*) [1])0x11603f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-logger-winit.cpp"
               ,0x6d);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (&local_58,&local_68,0x46,1,2,dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_,
               "dynamicgraph::CustomEntity::CLASS_NAME","CustomEntity","\"CustomEntity\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar3 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"CustomEntity",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"my-entity-2",&local_c9);
  lVar4 = dynamicgraph::FactoryStorage::newEntity(psVar3,local_a0);
  if (lVar4 == 0) {
    local_120 = (CustomEntity *)0x0;
  }
  else {
    local_120 = (CustomEntity *)
                __dynamic_cast(lVar4,&dynamicgraph::Entity::typeinfo,
                               &dynamicgraph::CustomEntity::typeinfo,0);
  }
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = local_120;
  for (local_d0 = 0; local_d0 < 1000; local_d0 = local_d0 + 1) {
    dynamicgraph::CustomEntity::testDebugTrace(local_80);
  }
  dynamicgraph::RealTimeLogger::destroy();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(debug_logger_wrong_initialization) {
  dynamicgraph::RealTimeLogger::instance();

  BOOST_CHECK_EQUAL(dynamicgraph::CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::CustomEntity &entity =
      *(dynamic_cast<dynamicgraph::CustomEntity *>(
          dynamicgraph::FactoryStorage::getInstance()->newEntity(
              "CustomEntity", "my-entity-2")));

  for (unsigned int i = 0; i < 1000; i++) {
    entity.testDebugTrace();
  }

  dynamicgraph::RealTimeLogger::destroy();
}